

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::a64::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  RABlockFlags *pRVar1;
  RegGroup RVar2;
  uint uVar3;
  FuncNode *pFVar4;
  RegGroup RVar5;
  uint uVar6;
  Error EVar7;
  FuncValuePack *this_00;
  FuncValue *pFVar8;
  BaseReg *imm_;
  Operand *pOVar9;
  InvokeNode *pIVar10;
  InvokeNode *argIndex;
  uint32_t valueIndex;
  size_t sVar11;
  RAWorkReg *workReg;
  uint32_t auStack_50 [2];
  FuncDetail *local_48;
  InvokeNode *local_40;
  long local_38;
  
  local_48 = &invokeNode->_funcDetail;
  local_40 = (InvokeNode *)(ulong)(invokeNode->_funcDetail)._argCount;
  (((this->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._cc)->super_BaseBuilder).
  _cursor = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
  argIndex = (InvokeNode *)0x0;
  do {
    if (argIndex == local_40) {
      (((this->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._cc)->super_BaseBuilder).
      _cursor = (BaseNode *)invokeNode;
      if ((invokeNode->_funcDetail)._rets._values[0]._data != 0) {
        sVar11 = 0;
        while ((sVar11 != 4 &&
               (pFVar8 = FuncValuePack::operator[](&(invokeNode->_funcDetail)._rets,sVar11),
               pFVar8->_data != 0))) {
          pOVar9 = InvokeNode::OperandPack::operator[](&invokeNode->_rets,sVar11);
          if (((pOVar9->super_Operand_)._signature._bits & 7) == 1) {
            EVar7 = BaseRAPass::virtIndexAsWorkReg
                              ((this->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                               _pass,(pOVar9->super_Operand_)._baseId - 0x100,&workReg);
            if (EVar7 != 0) {
              return EVar7;
            }
            if (((pFVar8->_data >> 8 & 1) != 0) &&
               (RVar2 = *(RegGroup *)((long)&(workReg->_signature)._bits + 1),
               RVar5 = arm::Reg::groupOf((RegType)(pFVar8->_data >> 0x18)),
               (RVar2 & kMaxValue) != RVar5)) {
              return 0x19;
            }
          }
          sVar11 = sVar11 + 1;
        }
      }
      pRVar1 = &((this->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock)->
                _flags;
      *pRVar1 = *pRVar1 | kHasFuncCalls;
      pFVar4 = ((this->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass)->_func;
      (pFVar4->_frame)._attributes = (pFVar4->_frame)._attributes | kHasFuncCalls;
      uVar6 = (invokeNode->_funcDetail)._argStackSize;
      uVar3 = (pFVar4->_frame)._callStackSize;
      if (uVar6 < uVar3) {
        uVar6 = uVar3;
      }
      (pFVar4->_frame)._callStackSize = uVar6;
      return 0;
    }
    this_00 = FuncDetail::argPack(local_48,(size_t)argIndex);
    local_38 = (long)argIndex << 6;
    sVar11 = 0;
    while ((sVar11 != 4 && (pFVar8 = FuncValuePack::operator[](this_00,sVar11), pFVar8->_data != 0))
          ) {
      pFVar8 = FuncValuePack::operator[](this_00,sVar11);
      pIVar10 = argIndex;
      imm_ = (BaseReg *)InvokeNode::arg(invokeNode,(size_t)argIndex,sVar11);
      uVar6 = (imm_->super_Operand).super_Operand_._signature._bits;
      if (uVar6 != 0) {
        uVar6 = uVar6 & 7;
        if (uVar6 == 3) {
          if ((pFVar8->_data & 0x100) == 0) {
            EVar7 = moveImmToStackArg(this,pIVar10,pFVar8,(Imm *)imm_);
LAB_00130911:
            if (EVar7 != 0) {
              return EVar7;
            }
          }
          else {
            workReg = (RAWorkReg *)0xff00000001;
            auStack_50[0] = 0;
            auStack_50[1] = 0;
            EVar7 = moveImmToRegArg(this,pIVar10,pFVar8,(Imm *)imm_,(BaseReg *)&workReg);
            if (EVar7 != 0) {
              return EVar7;
            }
            pOVar9 = InvokeNode::OperandPack::operator[]
                               ((OperandPack *)
                                ((long)invokeNode->_args->_data[0]._data + local_38 + -8),sVar11);
            *(RAWorkReg **)&pOVar9->super_Operand_ = workReg;
            *&(pOVar9->super_Operand_)._data = auStack_50;
          }
        }
        else if (uVar6 == 1) {
          uVar6 = (imm_->super_Operand).super_Operand_._baseId - 0x100;
          pIVar10 = (InvokeNode *)(ulong)uVar6;
          EVar7 = BaseRAPass::virtIndexAsWorkReg
                            ((this->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass
                             ,uVar6,&workReg);
          if (EVar7 != 0) {
            return EVar7;
          }
          if ((pFVar8->_data >> 8 & 1) == 0) {
            EVar7 = moveRegToStackArg(this,pIVar10,pFVar8,imm_);
            goto LAB_00130911;
          }
          RVar2 = *(RegGroup *)((long)&(workReg->_signature)._bits + 1);
          RVar5 = arm::Reg::groupOf((RegType)(pFVar8->_data >> 0x18));
          if ((RVar2 & kMaxValue) != RVar5) {
            return 0x19;
          }
        }
      }
      sVar11 = sVar11 + 1;
    }
    argIndex = (InvokeNode *)((long)(argIndex->super_InstNode).super_BaseNode.field_0._links + 1);
  } while( true );
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup != argGroup) {
            // TODO: [ARM] Conversion is not supported.
            return DebugUtils::errored(kErrorInvalidAssignment);
          }
        }
        else {
          ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup retGroup = Reg::groupOf(ret.regType());

          if (regGroup != retGroup) {
            // TODO: [ARM] Conversion is not supported.
            return DebugUtils::errored(kErrorInvalidAssignment);
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlockFlags::kHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncAttributes::kHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}